

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcRootLogLikelihoodsByPartitionAsync
          (BeagleCPUImpl<double,_1,_0> *this,int *bufferIndices,int *categoryWeightsIndices,
          int *stateFrequenciesIndices,int *cumulativeScaleIndices,int *partitionIndices,
          int partitionCount,double *outSumLogLikelihoodByPartition)

{
  long in_RCX;
  long in_RDX;
  BeagleCPUImpl<double,_1,_0> **in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  int in_stack_00000008;
  long in_stack_00000010;
  int i_1;
  unique_lock<std::mutex> l;
  threadData *td;
  packaged_task<void_()> threadTask;
  int partitionCountThread;
  int i;
  int threadsUsed;
  int currentPartitionIndex;
  int partitionsRemainder;
  int partitionsPerThreadFloor;
  mutex_type *__m;
  unique_lock<std::mutex> *this_00;
  shared_future<void> *__sf;
  packaged_task<void_()> *this_01;
  int **in_stack_fffffffffffffe90;
  _Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
  *in_stack_fffffffffffffe98;
  packaged_task<void_()> *this_02;
  BeagleCPUImpl<double,_1,_0> **in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  int local_13c;
  int **in_stack_fffffffffffffed0;
  int **in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  double **in_stack_fffffffffffffee8;
  undefined1 local_110 [40];
  undefined1 local_e8 [8];
  undefined1 local_e0 [16];
  _Head_base<1UL,_const_int_*,_false> local_d0;
  _Head_base<0UL,_beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_false> local_c8;
  undefined8 local_b8;
  undefined8 local_b0;
  packaged_task<void_()> local_a8 [5];
  BeagleCPUImpl<double,_1,_0> *local_58 [2];
  shared_future<void> local_48;
  int local_38;
  int local_34;
  long local_30;
  long local_28;
  long local_20;
  long local_18;
  BeagleCPUImpl<double,_1,_0> **local_10;
  
  local_34 = in_stack_00000008 / *(int *)(in_RDI + 0x138);
  local_38 = in_stack_00000008 % *(int *)(in_RDI + 0x138);
  local_48.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 0;
  if (*(int *)(in_RDI + 0x138) <= in_stack_00000008) {
    in_stack_00000008 = *(int *)(in_RDI + 0x138);
  }
  local_48.super___basic_future<void>._M_state.
  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = in_stack_00000008;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_48.super___basic_future<void>._M_state.
       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr.
       _4_4_ = 0;
      local_48.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
      < (int)local_48.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
      local_48.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr._4_4_
           = local_48.super___basic_future<void>._M_state.
             super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr._4_4_ + 1) {
    local_48.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_ =
         local_34;
    if (local_38 != 0) {
      local_48.super___basic_future<void>._M_state.
      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_4_
           = local_34 + 1;
      local_38 = local_38 + -1;
    }
    local_b0 = 0;
    local_b8 = 0x251;
    local_c8._M_head_impl =
         (BeagleCPUImpl<double,_1,_0> *)
         ((long)local_10 +
         (long)local_48.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ * 4);
    local_d0._M_head_impl =
         (int *)(local_18 +
                (long)local_48.super___basic_future<void>._M_state.
                      super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi._4_4_ * 4);
    local_e0._8_8_ =
         local_20 +
         (long)local_48.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ * 4;
    local_e0._0_8_ =
         local_28 +
         (long)local_48.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ * 4;
    local_e8 = (undefined1  [8])
               (local_30 +
               (long)local_48.super___basic_future<void>._M_state.
                     super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi._4_4_ * 4);
    local_110._32_8_ =
         in_stack_00000010 +
         (long)local_48.super___basic_future<void>._M_state.
               super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_ * 8;
    this_01 = (packaged_task<void_()> *)(local_110 + 0x20);
    __sf = &local_48;
    this_00 = (unique_lock<std::mutex> *)local_e8;
    __m = (mutex_type *)(local_e8 + 8);
    this_02 = local_a8;
    std::
    bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*)(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*),beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int&,double*>
              ((offset_in_BeagleCPUImpl<double,_1,_0>_to_subr *)
               CONCAT44(in_stack_00000008,in_stack_fffffffffffffeb0),in_stack_fffffffffffffea8,
               (int **)this_02,(int **)in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
               in_stack_fffffffffffffed0,in_stack_fffffffffffffed8,in_stack_fffffffffffffee0,
               in_stack_fffffffffffffee8);
    in_stack_fffffffffffffea8 = local_58;
    std::packaged_task<void()>::
    packaged_task<std::_Bind<void(beagle::cpu::BeagleCPUImpl<double,1,0>::*(beagle::cpu::BeagleCPUImpl<double,1,0>*,int_const*,int_const*,int_const*,int_const*,int_const*,int,double*))(int_const*,int_const*,int_const*,int_const*,int_const*,int,double*)>,void>
              (this_02,in_stack_fffffffffffffe98);
    std::packaged_task<void_()>::get_future((packaged_task<void_()> *)in_stack_fffffffffffffe98);
    in_stack_fffffffffffffe90 = (int **)(local_110 + 0x10);
    in_stack_fffffffffffffe98 =
         (_Bind<void_(beagle::cpu::BeagleCPUImpl<double,_1,_0>::*(beagle::cpu::BeagleCPUImpl<double,_1,_0>_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*))(const_int_*,_const_int_*,_const_int_*,_const_int_*,_const_int_*,_int,_double_*)>
          *)local_110;
    std::shared_future<void>::shared_future((shared_future<void> *)this_00,(future<void> *)__m);
    std::shared_future<void>::operator=((shared_future<void> *)this_01,__sf);
    std::shared_future<void>::~shared_future((shared_future<void> *)0x1709e9);
    std::future<void>::~future((future<void> *)0x1709f3);
    in_stack_fffffffffffffed8 =
         (int **)(*(long *)(in_RDI + 0x140) +
                 (long)local_48.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_ * 0xb8);
    std::unique_lock<std::mutex>::unique_lock(this_00,__m);
    in_RSI = local_58;
    std::
    queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
    ::push((queue<std::packaged_task<void_()>,_std::deque<std::packaged_task<void_()>,_std::allocator<std::packaged_task<void_()>_>_>_>
            *)this_00,(value_type *)__m);
    std::unique_lock<std::mutex>::unlock(this_00);
    std::condition_variable::notify_one();
    local_48.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._4_4_ = (int)local_48.super___basic_future<void>._M_state.
                       super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr +
                  local_48.super___basic_future<void>._M_state.
                  super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi._4_4_;
    std::unique_lock<std::mutex>::~unique_lock(this_00);
    std::packaged_task<void_()>::~packaged_task(this_01);
  }
  for (local_13c = 0; local_13c < *(int *)(in_RDI + 0x138); local_13c = local_13c + 1) {
    std::__basic_future<void>::wait
              ((__basic_future<void> *)(*(long *)(in_RDI + 0x170) + (long)local_13c * 0x10),in_RSI);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
    void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartitionAsync(
                                                        const int* bufferIndices,
                                                        const int* categoryWeightsIndices,
                                                        const int* stateFrequenciesIndices,
                                                        const int* cumulativeScaleIndices,
                                                        const int* partitionIndices,
                                                        int partitionCount,
                                                        double* outSumLogLikelihoodByPartition) {


    int partitionsPerThreadFloor = partitionCount / kNumThreads;
    int partitionsRemainder = partitionCount % kNumThreads;
    int currentPartitionIndex = 0;
    int threadsUsed = (partitionCount < kNumThreads ? partitionCount : kNumThreads);
    for (int i=0; i<threadsUsed; i++) {
        int partitionCountThread = partitionsPerThreadFloor;
        if (partitionsRemainder) {
            partitionCountThread++;
            partitionsRemainder--;
        }

        std::packaged_task<void()> threadTask(
            std::bind(&BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcRootLogLikelihoodsByPartition, this,
                      &bufferIndices[currentPartitionIndex], &categoryWeightsIndices[currentPartitionIndex],
                      &stateFrequenciesIndices[currentPartitionIndex], &cumulativeScaleIndices[currentPartitionIndex],
                      &partitionIndices[currentPartitionIndex], partitionCountThread,
                      &outSumLogLikelihoodByPartition[currentPartitionIndex]));

        gFutures[i] = threadTask.get_future();
        threadData* td = &gThreads[i];

        std::unique_lock<std::mutex> l(td->m);
        td->jobs.push(std::move(threadTask));
        l.unlock();

        gThreads[i].cv.notify_one();

        currentPartitionIndex += partitionCountThread;
    }

    for (int i=0; i<kNumThreads; i++) {
        gFutures[i].wait();
    }

}